

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

shared_ptr<mocker::ir::IRInst> __thiscall
mocker::replaceTerminatorLabel
          (mocker *this,shared_ptr<mocker::ir::IRInst> *inst,size_t oldLabel,size_t newLabel)

{
  size_t sVar1;
  size_t sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  undefined8 *puVar3;
  undefined8 *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *peVar7;
  shared_ptr<mocker::ir::IRInst> sVar8;
  undefined1 local_61;
  Branch *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  size_t local_48;
  shared_ptr<mocker::ir::Label> local_40;
  
  peVar7 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar7->type == Jump) {
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
  }
  else {
    peVar7 = (element_type *)0x0;
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)oldLabel;
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  local_48 = newLabel;
  if (peVar7 != (element_type *)0x0) {
    if (*(size_t *)(*(long *)&peVar7[1].type + 8) != oldLabel) {
      __assert_fail("p->getLabel()->getID() == oldLabel",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                    ,0x5a,
                    "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                   );
    }
    puVar3 = (undefined8 *)operator_new(0x20);
    puVar3[1] = 0x100000001;
    *puVar3 = &PTR___Sp_counted_ptr_inplace_001efa00;
    puVar3[2] = &PTR__Addr_001efab0;
    puVar3[3] = local_48;
    puVar4 = (undefined8 *)operator_new(0x38);
    puVar4[1] = 0x100000001;
    *puVar4 = &PTR___Sp_counted_ptr_inplace_001efc20;
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(puVar4 + 2);
    *(undefined4 *)(puVar4 + 3) = 0xc;
    puVar4[2] = &PTR__Jump_001efc70;
    puVar4[4] = &PTR__Jump_001efc90;
    puVar4[5] = puVar3 + 2;
    puVar4[6] = puVar3;
    local_50->_vptr__Sp_counted_base = (_func_int **)_Var5._M_pi;
    *(undefined8 **)&local_50->_M_use_count = puVar4;
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    _Var5._M_pi = extraout_RDX;
  }
  if (peVar7 == (element_type *)0x0) {
    peVar7 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar7->type == Branch) {
      p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
    }
    else {
      peVar7 = (element_type *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    if (peVar7 != (element_type *)0x0) {
      sVar1 = *(size_t *)(*(long *)&peVar7[2].type + 8);
      sVar2 = *(size_t *)(*(long *)&peVar7[3].type + 8);
      if (sVar1 == sVar2) {
        __assert_fail("p->getThen()->getID() != p->getElse()->getID()",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                      ,0x5e,
                      "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                     );
      }
      if (sVar1 == oldLabel) {
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
        (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count = 1;
        (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = 1;
        (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efa00;
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi + 1);
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001efab0;
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [1]._M_use_count = (undefined4)local_48;
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [1]._M_weak_count = local_48._4_4_;
        local_60 = (Branch *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::ir::Branch,std::allocator<mocker::ir::Branch>,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>const&>
                  (&local_58,&local_60,(allocator<mocker::ir::Branch> *)&local_61,
                   (shared_ptr<mocker::ir::Addr> *)&peVar7[1].type,&local_40,
                   (shared_ptr<mocker::ir::Label> *)&peVar7[3].type);
      }
      else {
        if (sVar2 != oldLabel) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                        ,0x67,
                        "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                       );
        }
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
        (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count = 1;
        (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = 1;
        (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efa00;
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi + 1);
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001efab0;
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [1]._M_use_count = (undefined4)local_48;
        local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [1]._M_weak_count = local_48._4_4_;
        local_60 = (Branch *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::ir::Branch,std::allocator<mocker::ir::Branch>,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>const&,std::shared_ptr<mocker::ir::Label>>
                  (&local_58,&local_60,(allocator<mocker::ir::Branch> *)&local_61,
                   (shared_ptr<mocker::ir::Addr> *)&peVar7[1].type,
                   (shared_ptr<mocker::ir::Label> *)&peVar7[2].type,&local_40);
      }
      _Var5._M_pi = local_58._M_pi;
      local_50->_vptr__Sp_counted_base = (_func_int **)local_60;
      local_50->_M_use_count = 0;
      local_50->_M_weak_count = 0;
      local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_50->_M_use_count = _Var5._M_pi;
      local_60 = (Branch *)0x0;
      _Var5._M_pi = local_50;
      if (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var5._M_pi = extraout_RDX_00;
      }
    }
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      _Var5._M_pi = extraout_RDX_01;
    }
    if (peVar7 == (element_type *)0x0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                    ,0x69,
                    "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                   );
    }
  }
  sVar8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_50;
  return (shared_ptr<mocker::ir::IRInst>)
         sVar8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ir::IRInst>
replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &inst,
                       std::size_t oldLabel, std::size_t newLabel) {
  if (auto p = ir::dyc<ir::Jump>(inst)) {
    assert(p->getLabel()->getID() == oldLabel);
    return std::make_shared<ir::Jump>(std::make_shared<ir::Label>(newLabel));
  }
  if (auto p = ir::dyc<ir::Branch>(inst)) {
    assert(p->getThen()->getID() != p->getElse()->getID());
    if (p->getThen()->getID() == oldLabel)
      return std::make_shared<ir::Branch>(p->getCondition(),
                                          std::make_shared<ir::Label>(newLabel),
                                          p->getElse());
    if (p->getElse()->getID() == oldLabel)
      return std::make_shared<ir::Branch>(
          p->getCondition(), p->getThen(),
          std::make_shared<ir::Label>(newLabel));
    assert(false);
  }
  assert(false);
}